

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void spill_restore_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,MIR_reg_t base_reg,MIR_insn_t anchor,
                      int after_p,int restore_p)

{
  long lVar1;
  ra_ctx *prVar2;
  VARR_MIR_reg_t *pVVar3;
  VARR_spill_cache_el_t *pVVar4;
  spill_cache_el_t *psVar5;
  bitmap_t pVVar6;
  bitmap_t *ppVVar7;
  VARR_live_range_t *pVVar8;
  void *pvVar9;
  byte bVar10;
  uint uVar11;
  MIR_type_t MVar12;
  MIR_reg_t loc;
  MIR_reg_t MVar13;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  int extraout_EDX;
  live_range_t_conflict plVar17;
  char *pcVar18;
  MIR_context_t bm;
  long lVar19;
  int iVar20;
  undefined4 in_register_00000034;
  VARR_bitmap_t *pVVar21;
  size_t nb;
  MIR_context_t pMVar22;
  MIR_context_t pMVar23;
  MIR_op_mode_t data_mode;
  ulong uVar24;
  uint uVar25;
  int *piVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  MIR_op_t mem_op;
  
  uVar16 = CONCAT44(in_register_00000034,reg);
  pMVar22 = gen_ctx->ctx;
  MVar12 = MIR_reg_type(pMVar22,reg - 0x21,(gen_ctx->curr_func_item->u).func);
  if (MVar12 == MIR_T_F) {
    data_mode = MIR_OP_FLOAT;
  }
  else if (MVar12 == MIR_T_D) {
    data_mode = MIR_OP_DOUBLE;
  }
  else {
    data_mode = (uint)(MVar12 == MIR_T_LD) * 4 + MIR_OP_INT;
  }
  prVar2 = gen_ctx->ra_ctx;
  pVVar3 = prVar2->reg_renumber;
  if (((pVVar3 == (VARR_MIR_reg_t *)0x0) || (pVVar3->varr == (MIR_reg_t *)0x0)) ||
     (uVar28 = (ulong)reg, pVVar3->els_num <= uVar28)) {
LAB_001725f9:
    spill_restore_reg_cold_7();
LAB_001725fe:
    __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
  }
  uVar27 = pVVar3->varr[uVar28];
  if (0x21 < uVar27) {
LAB_00172627:
    __assert_fail("hard_reg <= ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1eb0,
                  "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)");
  }
  pVVar21 = prVar2->used_locs;
  if (pVVar21 == (VARR_bitmap_t *)0x0) {
    spill_restore_reg_cold_6();
LAB_0017264b:
    spill_restore_reg_cold_5();
  }
  else {
    pVVar4 = prVar2->spill_cache;
    if (pVVar4 == (VARR_spill_cache_el_t *)0x0) goto LAB_0017264b;
    if ((reg == 0xffffffff) || (pVVar4->els_num <= uVar28)) goto LAB_001725fe;
    psVar5 = pVVar4->varr;
    if (psVar5[uVar28].age == prVar2->spill_cache_age) {
      loc = psVar5[uVar28].slot;
LAB_00172569:
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pcVar18 = "Restore";
        if (restore_p == 0) {
          pcVar18 = "Spill";
        }
        fprintf((FILE *)gen_ctx->debug_file,"    %s r%d:",pcVar18,uVar16);
      }
      add_ld_st(gen_ctx,&mem_op,loc,base_reg,data_mode,uVar27,(uint)(restore_p == 0),10,anchor,
                after_p);
      return;
    }
    pVVar6 = prVar2->conflict_locs1;
    if ((pVVar6 != (bitmap_t)0x0) && (pVVar6->varr != (bitmap_el_t *)0x0)) {
      pMVar22 = gen_ctx->ctx;
      ppVVar7 = pVVar21->varr;
      pVVar6->els_num = 0;
      pVVar8 = gen_ctx->lr_ctx->var_live_ranges;
      if ((pVVar8 == (VARR_live_range_t *)0x0) ||
         ((pVVar8->varr == (live_range_t_conflict *)0x0 || (pVVar8->els_num <= uVar28)))) {
        spill_restore_reg_cold_3();
      }
      else {
        for (plVar17 = pVVar8->varr[uVar28]; plVar17 != (live_range_t_conflict)0x0;
            plVar17 = plVar17->next) {
          if (plVar17->start <= plVar17->finish) {
            lVar19 = (long)plVar17->start + -1;
            do {
              bitmap_ior(pVVar6,pVVar6,ppVVar7[lVar19 + 1]);
              lVar19 = lVar19 + 1;
            } while (lVar19 < plVar17->finish);
          }
        }
        MVar12 = MIR_reg_type(pMVar22,reg - 0x21,(gen_ctx->curr_func_item->u).func);
        loc = get_stack_loc(gen_ctx,gen_ctx->ra_ctx->start_mem_loc,MVar12,pVVar6,(int *)&mem_op);
        psVar5[uVar28].slot = loc;
        psVar5[uVar28].age = gen_ctx->ra_ctx->spill_cache_age;
        pVVar8 = gen_ctx->lr_ctx->var_live_ranges;
        if (((pVVar8 != (VARR_live_range_t *)0x0) && (pVVar8->varr != (live_range_t_conflict *)0x0))
           && (uVar28 < pVVar8->els_num)) {
          plVar17 = pVVar8->varr[uVar28];
          if (plVar17 != (live_range_t_conflict)0x0) {
            do {
              lVar19 = (long)plVar17->start;
              if (plVar17->start <= plVar17->finish) {
                do {
                  uVar28 = (ulong)(uint)mem_op.data;
                  MVar13 = loc;
                  if (0 < (int)(uint)mem_op.data) {
                    do {
                      pVVar6 = ppVVar7[lVar19];
                      bitmap_expand(pVVar6,(ulong)MVar13 + 1);
                      if (pVVar6 == (bitmap_t)0x0) {
                        spill_restore_reg_cold_1();
                        goto LAB_001725f9;
                      }
                      pVVar6->varr[MVar13 >> 6] =
                           pVVar6->varr[MVar13 >> 6] | 1L << ((ulong)MVar13 & 0x3f);
                      MVar13 = MVar13 + 1;
                      uVar28 = uVar28 - 1;
                    } while (uVar28 != 0);
                  }
                  bVar30 = lVar19 < plVar17->finish;
                  lVar19 = lVar19 + 1;
                } while (bVar30);
              }
              plVar17 = plVar17->next;
            } while (plVar17 != (live_range_t)0x0);
          }
          goto LAB_00172569;
        }
      }
      spill_restore_reg_cold_2();
      goto LAB_00172627;
    }
  }
  iVar20 = (int)pVVar21;
  iVar15 = (int)uVar16;
  spill_restore_reg_cold_4();
  uVar28 = (ulong)pMVar22 & 0xffffffff;
  if (iVar20 == 0) {
    nb = uVar28 + 1;
    pMVar23 = bm;
    bitmap_expand((bitmap_t)bm,nb);
    iVar20 = (int)nb;
    if (bm == (MIR_context_t)0x0) goto LAB_001726c3;
    *(ulong *)(bm->error_func + (uVar28 >> 6) * 8) =
         *(ulong *)(bm->error_func + (uVar28 >> 6) * 8) | 1L << ((ulong)pMVar22 & 0x3f);
  }
  else {
    if (bm == (MIR_context_t)0x0) {
      update_live_cold_1();
      pMVar23 = pMVar22;
LAB_001726c3:
      update_live_cold_2();
      uVar28 = (ulong)(iVar15 != 0);
      pvVar9 = pMVar23[1].environment_module.data;
      lVar19 = 0x1e8;
      if (iVar15 == 0) {
        lVar19 = 0x188;
      }
      iVar15 = *(int *)((long)pvVar9 + uVar28 * 4 + 0x180);
      uVar24 = (ulong)iVar15;
      bVar30 = 0 < (long)uVar24;
      if ((long)uVar24 < 1) {
        uVar27 = 0;
      }
      else {
        uVar25 = extraout_EDX - 8;
        piVar26 = (int *)(lVar19 + 8 + (long)pvVar9);
        uVar27 = 0;
        uVar29 = 1;
        do {
          if ((iVar20 != -1) && (piVar26[-1] == iVar20)) break;
          if (uVar27 == 0) {
            iVar14 = 10;
            if (uVar25 < 3) {
              iVar14 = *(int *)(&DAT_001b3920 + (ulong)uVar25 * 4);
            }
            uVar11 = 1;
            if (*piVar26 != iVar14) goto LAB_00172767;
          }
          else {
LAB_00172767:
            iVar14 = 0xb;
            if (uVar25 < 3) {
              iVar14 = *(int *)(&DAT_001b392c + (ulong)uVar25 * 4);
            }
            uVar11 = uVar27;
            if (*piVar26 == iVar14) {
              uVar11 = 2;
            }
          }
          uVar27 = uVar11;
          bVar30 = uVar29 < uVar24;
          piVar26 = piVar26 + 3;
          lVar1 = (1 - uVar24) + uVar29;
          uVar29 = uVar29 + 1;
        } while (lVar1 != 1);
      }
      if (!bVar30) {
        if (1 < uVar27) {
          __assert_fail("rld_num <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
        }
        if (extraout_EDX == 10) {
          iVar14 = -1;
        }
        else {
          if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
            iVar14 = 0x19;
          }
          else {
            iVar14 = 0xb;
          }
          iVar14 = iVar14 - (uint)(uVar27 == 0);
        }
        *(int *)((long)pvVar9 + uVar28 * 4 + 0x180) = iVar15 + 1;
        if (7 < iVar15) {
          __assert_fail("rld_num < (2 * 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
        }
        *(int *)((long)pvVar9 + uVar24 * 0xc + lVar19 + 4) = iVar20;
        *(int *)((long)pvVar9 + uVar24 * 0xc + lVar19) = extraout_EDX;
        *(int *)((long)pvVar9 + uVar24 * 0xc + lVar19 + 8) = iVar14;
      }
      return;
    }
    if (uVar28 < (ulong)((long)bm->gen_ctx << 6)) {
      bVar10 = (byte)uVar28 & 0x3f;
      *(ulong *)(bm->error_func + (uVar28 >> 6) * 8) =
           *(ulong *)(bm->error_func + (uVar28 >> 6) * 8) &
           (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
    }
  }
  return;
}

Assistant:

static void spill_restore_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, MIR_reg_t base_reg,
                               MIR_insn_t anchor, int after_p, int restore_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t mem_loc;
  MIR_op_t mem_op;
  MIR_type_t type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
  MIR_op_mode_t data_mode = type2mode (type);
  MIR_reg_t hard_reg = VARR_GET (MIR_reg_t, reg_renumber, reg);
  gen_assert (hard_reg <= MAX_HARD_REG);
  mem_loc = get_spill_mem_loc (gen_ctx, reg);
  DEBUG (2, { fprintf (debug_file, "    %s r%d:", restore_p ? "Restore" : "Spill", reg); });
  add_ld_st (gen_ctx, &mem_op, mem_loc, base_reg, data_mode, hard_reg, !restore_p,
             TEMP_INT_HARD_REG1, anchor, after_p);
}